

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O2

bool slang::ast::OpInfo::isShift(BinaryOperator op)

{
  return op - LogicalShiftLeft < 4;
}

Assistant:

bool OpInfo::isShift(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            return true;
        default:
            return false;
    }
}